

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall re2c::path_t::append(path_t *this,path_t *p)

{
  bool bVar1;
  const_iterator __position;
  
  bVar1 = rule_rank_t::is_none(&(p->rule).rank);
  if (!bVar1) {
    (this->rule).restorectx = (p->rule).restorectx;
    (this->rule).rank.value = (p->rule).rank.value;
    this->rule_pos =
         ((long)(this->arcs).
                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->arcs).
                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) + p->rule_pos;
  }
  if (p->ctx == false) {
    __position._M_current =
         (this->arcs).
         super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    this->ctx = true;
    __position._M_current =
         (this->arcs).
         super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    this->ctx_pos =
         ((long)__position._M_current -
          (long)(this->arcs).
                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) + p->ctx_pos;
  }
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,void>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
              *)this,__position,
             (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*const_*,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              )(p->arcs).
               super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*const_*,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              )(p->arcs).
               super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void append (const path_t * p)
	{
		if (!p->rule.rank.is_none ())
		{
			rule = p->rule;
			rule_pos = arcs.size () + p->rule_pos;
		}
		if (p->ctx)
		{
			ctx = true;
			ctx_pos = arcs.size () + p->ctx_pos;
		}
		arcs.insert (arcs.end (), p->arcs.begin (), p->arcs.end ());
	}